

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xbox.cpp
# Opt level: O3

Texture * rw::xbox::readNativeTexture(Stream *stream)

{
  bool bVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  byte bVar5;
  int16 iVar6;
  uint16 uVar7;
  uint16 uVar8;
  uint32 uVar9;
  uint uVar10;
  Texture *pTVar11;
  Raster *this;
  void *pvVar12;
  uint8 *puVar13;
  undefined8 uVar14;
  long lVar15;
  uint32 vers;
  uint local_38;
  uint local_34;
  
  bVar1 = findChunk(stream,1,(uint32 *)0x0,&local_38);
  if (bVar1) {
    uVar9 = Stream::readU32(stream);
    if (uVar9 == 5) {
      if (0x34000 < local_38) {
        pTVar11 = Texture::create((Raster *)0x0);
        if (pTVar11 == (Texture *)0x0) {
          return (Texture *)0x0;
        }
        uVar9 = Stream::readU32(stream);
        pTVar11->filterAddressing = uVar9;
        (*stream->_vptr_Stream[4])(stream,pTVar11->name,0x20);
        (*stream->_vptr_Stream[4])(stream,pTVar11->mask,0x20);
        uVar10 = Stream::readI32(stream);
        iVar6 = Stream::readI16(stream);
        Stream::readI16(stream);
        uVar7 = Stream::readU16(stream);
        uVar8 = Stream::readU16(stream);
        bVar2 = Stream::readU8(stream);
        bVar3 = Stream::readU8(stream);
        bVar4 = Stream::readU8(stream);
        bVar5 = Stream::readU8(stream);
        local_34 = Stream::readI32(stream);
        if (bVar5 == 0) {
          this = Raster::create((uint)uVar7,(uint)uVar8,(uint)bVar2,uVar10 | bVar4,5);
        }
        else {
          this = Raster::create((uint)uVar7,(uint)uVar8,(uint)bVar2,uVar10 | bVar4 | 0x80,5);
          lVar15 = (long)nativeRasterOffset;
          *(uint *)((long)&this->format + lVar15) = (uint)bVar5;
          *(bool *)((long)&this->height + lVar15) = iVar6 != 0;
          uVar10 = 1;
          if ((short)this->format < 0) {
            uVar10 = (uint)bVar3;
          }
          pvVar12 = createTexture(this->width,this->height,uVar10,(uint)bVar5);
          *(void **)((long)&this->platform + lVar15) = pvVar12;
          *(undefined1 *)((long)&this->height + lVar15 + 1) = 1;
          *(byte *)&this->flags = (byte)this->flags & 0x7f;
        }
        lVar15 = (long)nativeRasterOffset;
        pTVar11->raster = this;
        uVar14 = 0x80;
        if ((((uint)this->format >> 0xe & 1) != 0) ||
           (uVar14 = 0x400, ((uint)this->format >> 0xd & 1) != 0)) {
          (*stream->_vptr_Stream[4])(stream,*(undefined8 *)((long)&this->flags + lVar15),uVar14);
        }
        puVar13 = Raster::lock(this,0,5);
        (*stream->_vptr_Stream[4])(stream,puVar13,(ulong)local_34);
        Raster::unlock(this,0);
        return pTVar11;
      }
      readNativeTexture((xbox *)&local_38);
    }
    else {
      readNativeTexture((xbox *)(ulong)uVar9);
    }
  }
  else {
    readNativeTexture();
  }
  return (Texture *)0x0;
}

Assistant:

Texture*
readNativeTexture(Stream *stream)
{
	uint32 vers, platform;
	if(!findChunk(stream, ID_STRUCT, nil, &vers)){
		RWERROR((ERR_CHUNK, "STRUCT"));
		return nil;
	}
	platform = stream->readU32();
	if(platform != PLATFORM_XBOX){
		RWERROR((ERR_PLATFORM, platform));
		return nil;
	}
	if(vers < 0x34001){
		RWERROR((ERR_VERSION, vers));
		return nil;
	}
	Texture *tex = Texture::create(nil);
	if(tex == nil)
		return nil;


	// Texture
	tex->filterAddressing = stream->readU32();
	stream->read8(tex->name, 32);
	stream->read8(tex->mask, 32);

//if(strcmp(tex->name, "bluallu") == 0)
//__debugbreak();

	// Raster
	int32 format = stream->readI32();
	bool32 hasAlpha = stream->readI16();
	bool32 unknownFlag = stream->readI16();
	int32 width = stream->readU16();
	int32 height = stream->readU16();
	int32 depth = stream->readU8();
	int32 numLevels = stream->readU8();
	int32 type = stream->readU8();
	int32 compression = stream->readU8();
	int32 totalSize = stream->readI32();

	// isn't this the cube map flag?
	assert(unknownFlag == 0);
	Raster *raster;
	if(compression){
		raster = Raster::create(width, height, depth, format | type | Raster::DONTALLOCATE, PLATFORM_XBOX);
		XboxRaster *ras = GETXBOXRASTEREXT(raster);
		ras->format = compression;
		ras->hasAlpha = hasAlpha;
		ras->texture = createTexture(raster->width, raster->height,
	                                     raster->format & Raster::MIPMAP ? numLevels : 1,
	                                     ras->format);
		ras->customFormat = 1;
		raster->flags &= ~Raster::DONTALLOCATE;
	}else
		raster = Raster::create(width, height, depth, format | type, PLATFORM_XBOX);
	XboxRaster *ras = GETXBOXRASTEREXT(raster);
	tex->raster = raster;

	if(raster->format & Raster::PAL4)
		stream->read8(ras->palette, 4*32);
	else if(raster->format & Raster::PAL8)
		stream->read8(ras->palette, 4*256);

	// exploit the fact that mipmaps are allocated consecutively
	uint8 *data = raster->lock(0, Raster::LOCKWRITE|Raster::LOCKNOFETCH);
	stream->read8(data, totalSize);
	raster->unlock(0);

	return tex;
}